

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O3

ptrdiff_t __thiscall
soplex::
ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
::reMax(ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        *this,int newMax,int newSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  uint n;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *newMem;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_28;
  
  if (newSize < 0) {
    newSize = this->thesize;
  }
  if (newMax <= newSize) {
    newMax = newSize;
  }
  n = 1;
  if (1 < newMax) {
    n = newMax;
  }
  if (n == this->themax) {
    this->thesize = newSize;
    return 0;
  }
  local_28 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0;
  spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
            (&local_28,n);
  uVar7 = 0;
  if ((0 < newSize) && (0 < this->thesize)) {
    lVar8 = 0x38;
    uVar7 = 0;
    do {
      pNVar3 = this->data;
      *(undefined8 *)((long)(local_28->val).m_backend.data._M_elems + lVar8 + -0x18) =
           *(undefined8 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar8 + -0x18);
      puVar1 = (undefined8 *)((long)(&pNVar3->val + -1) + lVar8);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar1 = (undefined8 *)((long)(&(pNVar3->val).m_backend.data + -1) + lVar8);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)(&(local_28->val).m_backend.data + -1) + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      puVar1 = (undefined8 *)((long)(&local_28->val + -1) + lVar8);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      *(undefined4 *)((long)(local_28->val).m_backend.data._M_elems + lVar8 + -0x10) =
           *(undefined4 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar8 + -0x10);
      *(undefined1 *)((long)(local_28->val).m_backend.data._M_elems + lVar8 + -0xc) =
           *(undefined1 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar8 + -0xc);
      *(undefined8 *)((long)(local_28->val).m_backend.data._M_elems + lVar8 + -8) =
           *(undefined8 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar8 + -8);
      *(undefined4 *)((long)(local_28->val).m_backend.data._M_elems + lVar8) =
           *(undefined4 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar8);
      uVar7 = uVar7 + 1;
      if ((uint)newSize <= uVar7) break;
      lVar8 = lVar8 + 0x3c;
    } while ((long)uVar7 < (long)this->thesize);
    if (n <= (uint)uVar7) goto LAB_0024bd40;
  }
  piVar9 = &local_28[uVar7].idx;
  lVar8 = n - uVar7;
  do {
    *(undefined8 *)(piVar9 + -2) = 0xa00000000;
    (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)(piVar9 + -0xe))->val).m_backend.data._M_elems[0] = 0;
    (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)(piVar9 + -0xe))->val).m_backend.data._M_elems[1] = 0;
    (piVar9 + -0xc)[0] = 0;
    (piVar9 + -0xc)[1] = 0;
    (piVar9 + -10)[0] = 0;
    (piVar9 + -10)[1] = 0;
    (piVar9 + -8)[0] = 0;
    (piVar9 + -8)[1] = 0;
    *(undefined8 *)((long)piVar9 + -0x1b) = 0;
    *(undefined8 *)((long)piVar9 + -0x13) = 0;
    *piVar9 = 0;
    piVar9 = piVar9 + 0xf;
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
LAB_0024bd40:
  lVar8 = (long)local_28 - (long)this->data;
  free(this->data);
  this->data = local_28;
  this->themax = n;
  this->thesize = newSize;
  return lVar8;
}

Assistant:

ptrdiff_t reMax(int newMax = 1, int newSize = -1)
   {
      /* process input */
      if(newSize < 0)
         newSize = size();

      if(newMax < 1)
         newMax = 1;

      if(newMax < newSize)
         newMax = newSize;

      /* nothing to reallocate */
      if(newMax == themax)
      {
         thesize = newSize;
         return 0;
      }

      /* allocate new memory */
      T* newMem = nullptr;
      spx_alloc(newMem, newMax);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < size() && i < newSize; i++)
         new(&(newMem[i])) T(data[i]);

      /* call default constructor for remaining elements */
      for(; i < newMax; i++)
         new(&(newMem[i])) T();

      /* compute pointer difference */
      ptrdiff_t pshift = reinterpret_cast<char*>(newMem) - reinterpret_cast<char*>(data);

      /* free old memory */
      for(i = themax - 1; i >= 0; i--)
         data[i].~T();

      spx_free(data);

      /* assign new memory */
      data = newMem;
      themax = newMax;
      thesize = newSize;

      return pshift;
   }